

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

bool __thiscall
nlohmann::json_abi_v3_11_2::detail::
lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
::next_byte_in_range
          (lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
           *this,initializer_list<int> ranges)

{
  long lVar1;
  int *piVar2;
  char cVar3;
  
  piVar2 = ranges._M_array;
  cVar3 = (char)this + 'P';
  std::__cxx11::string::push_back(cVar3);
  lVar1 = ranges._M_len << 2;
  do {
    if (lVar1 == 0) {
LAB_0010a0b1:
      return lVar1 == 0;
    }
    get(this);
    if ((this->current < *piVar2) || (piVar2[1] < this->current)) {
      this->error_message = "invalid string: ill-formed UTF-8 byte";
      goto LAB_0010a0b1;
    }
    std::__cxx11::string::push_back(cVar3);
    piVar2 = piVar2 + 2;
    lVar1 = lVar1 + -8;
  } while( true );
}

Assistant:

bool next_byte_in_range(std::initializer_list<char_int_type> ranges)
    {
        JSON_ASSERT(ranges.size() == 2 || ranges.size() == 4 || ranges.size() == 6);
        add(current);

        for (auto range = ranges.begin(); range != ranges.end(); ++range)
        {
            get();
            if (JSON_HEDLEY_LIKELY(*range <= current && current <= *(++range)))
            {
                add(current);
            }
            else
            {
                error_message = "invalid string: ill-formed UTF-8 byte";
                return false;
            }
        }

        return true;
    }